

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error externalEntityContentProcessor(XML_Parser parser,char *start,char *end,char **endPtr)

{
  XML_Bool XVar1;
  XML_Error result;
  char **endPtr_local;
  char *end_local;
  char *start_local;
  XML_Parser parser_local;
  
  parser_local._4_4_ =
       doContent(parser,1,parser->m_encoding,start,end,endPtr,
                 ((parser->m_parsingStatus).finalBuffer != '\0' ^ 0xffU) & 1,
                 XML_ACCOUNT_ENTITY_EXPANSION);
  if ((parser_local._4_4_ == XML_ERROR_NONE) && (XVar1 = storeRawNames(parser), XVar1 == '\0')) {
    parser_local._4_4_ = XML_ERROR_NO_MEMORY;
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error PTRCALL
externalEntityContentProcessor(XML_Parser parser, const char *start,
                               const char *end, const char **endPtr) {
  enum XML_Error result
      = doContent(parser, 1, parser->m_encoding, start, end, endPtr,
                  (XML_Bool)! parser->m_parsingStatus.finalBuffer,
                  XML_ACCOUNT_ENTITY_EXPANSION);
  if (result == XML_ERROR_NONE) {
    if (! storeRawNames(parser))
      return XML_ERROR_NO_MEMORY;
  }
  return result;
}